

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_posix1e.c
# Opt level: O3

void test_acl_posix1e(void)

{
  wchar_t wVar1;
  mode_t mVar2;
  archive_entry *entry;
  ulong uVar3;
  int *piVar4;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'Õ',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81ff);
  set_acls(entry,acls0,3);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  wVar1 = archive_entry_acl_reset(entry,L'Ā');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'ä',(uint)(wVar1 == L'\0'),
                   "0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  mVar2 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar2 & 0x1ff));
  mVar2 = archive_entry_mode(entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'ç',(uint)((mVar2 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  set_acls(entry,acls1,4);
  failure("One extended ACL should flag all ACLs to be returned.");
  wVar1 = archive_entry_acl_reset(entry,L'Ā');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'í',(uint)(wVar1 == L'\x04'),
                   "4 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  compare_acls(entry,acls1,4,0x62);
  mVar2 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar2 & 0x1ff));
  mVar2 = archive_entry_mode(entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'ñ',(uint)((mVar2 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  set_acls(entry,acls2,6);
  wVar1 = archive_entry_acl_reset(entry,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                      ,L'ö',6,"6",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  compare_acls(entry,acls2,6,0x163);
  mVar2 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0543, not %04o",(ulong)(mVar2 & 0x1ff));
  mVar2 = archive_entry_mode(entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'ú',(uint)((mVar2 & 0x1ff) == 0x163),"(archive_entry_mode(ae) & 0777) == 0543"
                   ,(void *)0x0);
  set_acls(entry,acls0,3);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  wVar1 = archive_entry_acl_reset(entry,L'Ā');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'Ă',(uint)(wVar1 == L'\0'),
                   "0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  mVar2 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar2 & 0x1ff));
  mVar2 = archive_entry_mode(entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'ą',(uint)((mVar2 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  set_acls(entry,acls2,6);
  piVar4 = &acls_nfs4[0].qual;
  uVar3 = 0;
  do {
    failure("Malformed ACL test #%d",uVar3 & 0xffffffff);
    wVar1 = archive_entry_acl_add_entry
                      (entry,((acl_t *)(piVar4 + -3))->type,piVar4[-2],piVar4[-1],*piVar4,"");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                        ,L'đ',-0x19,"ARCHIVE_FAILED",(long)wVar1,
                        "archive_entry_acl_add_entry(ae, p->type, p->permset, p->tag, p->qual, p->name)"
                        ,(void *)0x0);
    wVar1 = archive_entry_acl_reset(entry,L'Ā');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                        ,L'Ĕ',6,"6",(long)wVar1,
                        "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
    uVar3 = uVar3 + 1;
    piVar4 = piVar4 + 6;
  } while (uVar3 != 7);
  archive_entry_free(entry);
  return;
}

Assistant:

DEFINE_TEST(test_acl_posix1e)
{
	struct archive_entry *ae;
	int i;

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "file");
        archive_entry_set_mode(ae, S_IFREG | 0777);

	/* Basic owner/owning group should just update mode bits. */

	/*
	 * Note: This features of libarchive's ACL implementation
	 * shouldn't be relied on and should probably be removed.  It
	 * was done to identify trivial ACLs so we could avoid
	 * triggering unnecessary extensions.  It's better to identify
	 * trivial ACLs at the point they are being read from disk.
	 */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);


	/* With any extended ACL entry, we should read back a full set. */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	failure("One extended ACL should flag all ACLs to be returned.");
	assert(4 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]), 0142);
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);


	/* A more extensive set of ACLs. */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	assertEqualInt(6, archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]), 0543);
	failure("Basic ACLs should set mode to 0543, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0543);

	/*
	 * Check that clearing ACLs gets rid of them all by repeating
	 * the first test.
	 */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/*
	 * Different types of malformed ACL entries that should
	 * fail when added to existing POSIX.1e ACLs.
	 */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	for (i = 0; i < (int)(sizeof(acls_nfs4)/sizeof(acls_nfs4[0])); ++i) {
		struct acl_t *p = &acls_nfs4[i];
		failure("Malformed ACL test #%d", i);
		assertEqualInt(ARCHIVE_FAILED,
		    archive_entry_acl_add_entry(ae,
			p->type, p->permset, p->tag, p->qual, p->name));
		assertEqualInt(6,
		    archive_entry_acl_reset(ae,
			ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	}
	archive_entry_free(ae);
}